

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_declaration.c
# Opt level: O0

void parse_declarator_inner(Translation_Data *translation_data,Scope *scope,Denoted_Base *base)

{
  char cVar1;
  KEYWORDS KVar2;
  Type *pTVar3;
  char local_26;
  char local_25;
  char is_volatile;
  char is_const;
  KEYWORDS hold;
  Denoted_Base *base_local;
  Scope *scope_local;
  Translation_Data *translation_data_local;
  
  while (cVar1 = get_and_check(translation_data,KW_STAR), cVar1 != '\0') {
    local_26 = '\0';
    local_25 = '\0';
    while( true ) {
      while (KVar2 = kw_get(translation_data), KVar2 == KW_CONST) {
        chomp(translation_data);
        local_25 = '\x01';
      }
      if (KVar2 != KW_VOLATILE) break;
      chomp(translation_data);
      local_26 = '\x01';
    }
    pTVar3 = get_pointer_type(base->type,local_25,local_26);
    base->type = pTVar3;
  }
  parse_direct_declarator(translation_data,scope,base);
  return;
}

Assistant:

void parse_declarator_inner(struct Translation_Data *translation_data,struct Scope *scope,struct Denoted_Base *base)
{
	enum KEYWORDS hold;
	char is_const;
	char is_volatile;
	while(get_and_check(translation_data,KW_STAR))
	{
		is_const=is_volatile=0;
		while(1)
		{
			hold=kw_get(translation_data);
			if(hold==KW_CONST)
			{
				chomp(translation_data);
				is_const=1;
			}else if(hold==KW_VOLATILE)
			{
				chomp(translation_data);
				is_volatile=1;
			}else
			{
				break;
			}
		}
		base->type=(struct Type*)get_pointer_type(base->type,is_const,is_volatile);
	}
	parse_direct_declarator(translation_data,scope,base);

}